

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ICrash.cpp
# Opt level: O3

void updateParameters(Quadratic *idata,ICrashOptions *options,int iteration)

{
  pointer pdVar1;
  long lVar2;
  long lVar3;
  vector<double,_std::allocator<double>_> residual;
  allocator_type local_31;
  vector<double,_std::allocator<double>_> local_30;
  value_type_conflict1 local_18;
  
  if (iteration == 1) {
    return;
  }
  switch(options->strategy) {
  case kPenalty:
    break;
  case kAdmm:
    highsLogUser(&options->log_options,kInfo,
                 "ICrashError: ADMM parameter update not implemented yet.");
    return;
  case kICA:
    if (0x55555554 < iteration * -0x55555555 + 0x2aaaaaaaU) {
      local_18 = 0.0;
      std::vector<double,_std::allocator<double>_>::vector
                (&local_30,(long)(idata->lp).num_row_,&local_18,&local_31);
      updateResidualIca(&idata->lp,&idata->xk,&local_30);
      lVar2 = (long)(idata->lp).num_row_;
      if (0 < lVar2) {
        pdVar1 = (idata->lambda).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar3 = 0;
        do {
          pdVar1[lVar3] =
               idata->mu *
               local_30.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar3];
          lVar3 = lVar3 + 1;
        } while (lVar2 != lVar3);
        goto LAB_00329f98;
      }
LAB_00329f93:
      if (local_30.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start == (pointer)0x0) {
        return;
      }
LAB_00329f98:
      operator_delete(local_30.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
      return;
    }
    break;
  case kUpdatePenalty:
    if (0x55555554 < iteration * -0x55555555 + 0x2aaaaaaaU) {
      return;
    }
    break;
  case kUpdateAdmm:
    if (0x55555554 < iteration * -0x55555555 + 0x2aaaaaaaU) {
      calculateRowValuesQuad(&idata->lp,&idata->xk,-1);
      local_18 = 0.0;
      std::vector<double,_std::allocator<double>_>::vector
                (&local_30,(long)(idata->lp).num_row_,&local_18,&local_31);
      updateResidualFast(&idata->lp,&idata->xk,&local_30);
      lVar2 = (long)(idata->lp).num_row_;
      if (0 < lVar2) {
        pdVar1 = (idata->lambda).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar3 = 0;
        do {
          pdVar1[lVar3] =
               idata->mu *
               local_30.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar3] + pdVar1[lVar3];
          lVar3 = lVar3 + 1;
        } while (lVar2 != lVar3);
        goto LAB_00329f98;
      }
      goto LAB_00329f93;
    }
    break;
  default:
    goto switchD_00329e31_default;
  }
  idata->mu = idata->mu * 0.1;
switchD_00329e31_default:
  return;
}

Assistant:

void updateParameters(Quadratic& idata, const ICrashOptions& options,
                      const int iteration) {
  if (iteration == 1) return;

  // The other strategies are WIP.
  switch (options.strategy) {
    case ICrashStrategy::kPenalty: {
      idata.mu = 0.1 * idata.mu;
      break;
    }
    case ICrashStrategy::kAdmm: {
      // std::cout << "ICrash Error: ADMM parameter update not implemented." <<
      // std::endl;
      highsLogUser(options.log_options, HighsLogType::kInfo,
                   "ICrashError: ADMM parameter update not implemented yet.");
      break;
    }
    case ICrashStrategy::kICA: {
      // Update mu every third iteration, otherwise update lambda.
      if (iteration % 3 == 0) {
        idata.mu = 0.1 * idata.mu;
      } else {
        std::vector<double> residual_ica(idata.lp.num_row_, 0);
        updateResidualIca(idata.lp, idata.xk, residual_ica);
        for (int row = 0; row < idata.lp.num_row_; row++)
          idata.lambda[row] = idata.mu * residual_ica[row];
      }
      break;
    }
    case ICrashStrategy::kUpdatePenalty: {
      // Update mu every third iteration, otherwise do nothing.
      if (iteration % 3 == 0) idata.mu = 0.1 * idata.mu;
      break;
    }
    case ICrashStrategy::kUpdateAdmm: {
      // Update mu every third iteration, otherwise update lambda.
      if (iteration % 3 == 0) {
        idata.mu = 0.1 * idata.mu;
      } else {
        calculateRowValuesQuad(idata.lp, idata.xk);
        std::vector<double> residual(idata.lp.num_row_, 0);
        updateResidualFast(idata.lp, idata.xk, residual);
        for (int row = 0; row < idata.lp.num_row_; row++)
          // todo: double check clp.
          idata.lambda[row] = idata.lambda[row] + idata.mu * residual[row];
      }
      break;
    }
  }
}